

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

bool Memory::
     SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
     ::RescanObjectsOnPage
               (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block,
               char *pageAddress,char *blockStartAddress,BVStatic<256UL> *heapBlockMarkBits,
               uint localObjectSize,uint bucketIndex,bool *anyObjectRescanned,Recycler *recycler)

{
  MarkData *pMVar1;
  size_t *psVar2;
  ushort uVar3;
  Recycler *pRVar4;
  code *pcVar5;
  size_t sVar6;
  bool bVar7;
  BOOLEAN BVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  uint pageStartBitIndex;
  char *error;
  undefined4 *puVar15;
  uint bitIndex;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  BVIndex BVar23;
  undefined8 *in_FS_OFFSET;
  MarkCandidate item;
  ulong uVar19;
  
  pMVar1 = &(recycler->collectionStats).markData;
  pMVar1->rescanPageCount = pMVar1->rescanPageCount + 1;
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar21 = 0xffffffffffffffff;
    do {
      if (uVar21 == 2) goto LAB_002a78d8;
      uVar19 = uVar21 + 1;
      lVar17 = uVar21 + 2;
      uVar21 = uVar19;
    } while (heapBlockMarkBits->data[lVar17].word == 0);
    if (2 < uVar19) {
LAB_002a78d8:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)*in_FS_OFFSET;
      *puVar15 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,100,"(!heapBlockMarkBits->IsAllClear())",
                         "!heapBlockMarkBits->IsAllClear()");
      if (!bVar7) goto LAB_002a80da;
      *puVar15 = 0;
    }
  }
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = false;
  }
  uVar21 = (long)pageAddress - (long)blockStartAddress;
  if (0xfff < uVar21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    *puVar15 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x6b,
                       "((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize)"
                       ,
                       "(char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize"
                      );
    if (!bVar7) goto LAB_002a80da;
    *puVar15 = 0;
  }
  uVar19 = (uVar21 & 0xffffffff) / (ulong)localObjectSize;
  uVar18 = (uint)uVar19;
  pcVar14 = blockStartAddress + uVar18 * localObjectSize;
  if (((ulong)pcVar14 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    *puVar15 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar7) goto LAB_002a80da;
    *puVar15 = 0;
  }
  if (0xfffefff < (uint)uVar21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    *puVar15 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x77,"(pageByteOffset / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                       "pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX");
    if (!bVar7) goto LAB_002a80da;
    *puVar15 = 0;
  }
  if (0x300 < localObjectSize || (localObjectSize & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    *puVar15 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0xc4,"(IsAlignedSmallObjectSize(sizeCat))",
                       "IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar7) goto LAB_002a80da;
    *puVar15 = 0;
  }
  uVar22 = (localObjectSize >> 4) - 1;
  if (0x2f < uVar22) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    *puVar15 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,400,"(index < TBlockAttributes::BucketCount)",
                       "index < TBlockAttributes::BucketCount");
    if (!bVar7) goto LAB_002a80da;
    *puVar15 = 0;
  }
  pageStartBitIndex = (uint)(uVar21 >> 4) & 0xfffffff;
  uVar21 = uVar21 >> 0xc & 0xffff;
  uVar10 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  uVar3 = *(ushort *)((ulong)uVar22 * 4 + 0x3967fa + uVar21 * 4);
  uVar11 = (uint)(0x1000 / (ulong)localObjectSize);
  if (uVar11 <= uVar18) {
    ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,3);
  }
  bVar7 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::CanRescanFullBlock();
  if ((bVar7) && (uVar20 = (uint)uVar3, uVar10 == uVar20)) {
    if ((recycler->collectionState).value == CollectionStateParallelMark) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)*in_FS_OFFSET;
      *puVar15 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                         "this->collectionState != CollectionStateParallelMark");
      if (!bVar7) goto LAB_002a80da;
      *puVar15 = 0;
    }
    if (pageAddress == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)*in_FS_OFFSET;
      *puVar15 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                         ,9,"(objectAddress != nullptr)","objectAddress != nullptr");
      if (!bVar7) goto LAB_002a80da;
      *puVar15 = 0;
    }
    pRVar4 = (recycler->markContext).recycler;
    if ((pRVar4->forceTraceMark != false) ||
       (bVar7 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MarkPhase), bVar7)) {
      Output::Print(L" %p",pageAddress);
    }
    LOCK();
    psVar2 = &(((recycler->markContext).recycler)->collectionStats).scanCount;
    *(int *)psVar2 = (int)*psVar2 + 1;
    UNLOCK();
    item.byteCount = 0x1000;
    item.obj = (void **)pageAddress;
    bVar7 = PageStack<Memory::MarkContext::MarkCandidate>::Push
                      (&(recycler->markContext).markStack,item);
    if (!bVar7) {
      return false;
    }
    sVar6 = (recycler->collectionStats).markData.rescanObjectByteCount;
    (recycler->collectionStats).markData.rescanObjectCount =
         (ulong)uVar20 + (recycler->collectionStats).markData.rescanObjectCount;
    (recycler->collectionStats).markData.rescanObjectByteCount = uVar10 * localObjectSize + sVar6;
    bVar9 = true;
    if (anyObjectRescanned == (bool *)0x0) {
      return true;
    }
    goto LAB_002a80c1;
  }
  uVar16 = (ulong)pcVar14 >> 4 & 0xff;
  if (pcVar14 == pageAddress) {
    bVar7 = true;
  }
  else {
    if (pcVar14 < blockStartAddress || pageAddress <= pcVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)*in_FS_OFFSET;
      *puVar15 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x9f,
                         "(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress)"
                         ,
                         "startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress"
                        );
      if (!bVar7) goto LAB_002a80da;
      *puVar15 = 0;
    }
    BVar8 = BVStatic<256UL>::Test(heapBlockMarkBits,(BVIndex)uVar16);
    bVar7 = BVar8 != '\x01';
    uVar10 = uVar10 + (BVar8 == '\x01');
  }
  uVar12 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetObjectBitDeltaForBucketIndex
                     (bucketIndex);
  uVar20 = 0;
  if (uVar10 != 0) {
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    do {
      uVar18 = (uint)uVar19;
      if (uVar11 <= uVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xae,"(objectIndex < localObjectCount)","objectIndex < localObjectCount"
                          );
        if (!bVar9) goto LAB_002a80da;
        *puVar15 = 0;
      }
      if (0x2f < bucketIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                           ,0x186,"(index < TBlockAttributes::BucketCount)",
                           "index < TBlockAttributes::BucketCount");
        if (!bVar9) goto LAB_002a80da;
        *puVar15 = 0;
      }
      BVar23 = (BVIndex)uVar16;
      BVar8 = BVStatic<256UL>::Test
                        (HeapInfo::smallAllocValidPointersMap.invalidBitsBuffers + bucketIndex,
                         BVar23);
      if (BVar8 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xaf,
                           "(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex))"
                           ,
                           "!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex)"
                          );
        if (!bVar9) goto LAB_002a80da;
        *puVar15 = 0;
      }
      BVar8 = BVStatic<256UL>::Test(heapBlockMarkBits,BVar23);
      if (BVar8 != '\0') {
        bVar9 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::RescanObject
                          (&block->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,
                           blockStartAddress + uVar18 * localObjectSize,localObjectSize,uVar18,
                           recycler);
        if (!bVar9) {
          return false;
        }
        uVar20 = uVar20 + 1;
      }
      uVar18 = uVar18 + 1;
      uVar19 = (ulong)uVar18;
      uVar16 = (ulong)(BVar23 + uVar12);
    } while (uVar20 < uVar10);
    uVar20 = 1;
  }
  bVar9 = SUB41(uVar20,0);
  uVar13 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  if (pcVar14 == pageAddress || bVar7) {
    if (uVar10 != uVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)*in_FS_OFFSET;
      *puVar15 = 1;
      error = 
      "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex))"
      ;
      pcVar14 = 
      "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex)"
      ;
      uVar10 = 0xc5;
LAB_002a8001:
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,uVar10,error,pcVar14);
      if (!bVar7) {
LAB_002a80da:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar15 = 0;
    }
  }
  else if (uVar10 != uVar13 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    *puVar15 = 1;
    error = 
    "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1)"
    ;
    pcVar14 = 
    "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1"
    ;
    uVar10 = 0xc1;
    goto LAB_002a8001;
  }
  lVar17 = (ulong)uVar22 * 4 + 0x3967f8;
  uVar18 = uVar18 + 1;
  if (uVar18 < *(ushort *)(lVar17 + uVar21 * 4)) {
    puVar15 = (undefined4 *)*in_FS_OFFSET;
    BVar23 = uVar12 * uVar18;
    do {
      BVar8 = BVStatic<256UL>::Test(heapBlockMarkBits,BVar23);
      if (BVar8 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xcd,"(!heapBlockMarkBits->Test(i * objectBitDelta))",
                           "!heapBlockMarkBits->Test(i * objectBitDelta)");
        if (!bVar7) goto LAB_002a80da;
        *puVar15 = 0;
      }
      uVar18 = uVar18 + 1;
      BVar23 = BVar23 + uVar12;
    } while (uVar18 < *(ushort *)(lVar17 + uVar21 * 4));
  }
  if (anyObjectRescanned == (bool *)0x0) {
    return true;
  }
LAB_002a80c1:
  *anyObjectRescanned = bVar9;
  return true;
}

Assistant:

bool
SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(TBlockType * block, char* pageAddress, char * blockStartAddress, BVStatic<TBlockAttributes::BitVectorCount> * heapBlockMarkBits, const uint localObjectSize, uint bucketIndex, __out_opt bool* anyObjectRescanned, Recycler * recycler)
{
    RECYCLER_STATS_ADD(recycler, markData.rescanPageCount, TBlockAttributes::PageCount);

    // By the time we get here, we should have ensured that there's a mark on any page somewhere.
    // REVIEW: Worth check on just the page's mark bits?
    Assert(!heapBlockMarkBits->IsAllClear());

    if (anyObjectRescanned != nullptr)
    {
        *anyObjectRescanned = false;
    }

    Assert((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize);
    const uint pageByteOffset = static_cast<uint>((char*)pageAddress - blockStartAddress);
    uint firstObjectOnPageIndex = pageByteOffset / localObjectSize;

    // This is not necessarily the address on the first object that starts on the page
    // If the last object on the previous page spans two pages, this is the address of that object
    // We do it this way so that we can figure out if we need to rescan the first few bytes of the page
    // if the actual first object on this page is not located at the start of the page
    char* const startObjectAddress = blockStartAddress + (firstObjectOnPageIndex * localObjectSize);
    const uint startBitIndex = TBlockType::GetAddressBitIndex(startObjectAddress);
    const uint pageStartBitIndex = pageByteOffset >> HeapConstants::ObjectAllocationShift;

    Assert(pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX);
    const ushort pageNumber = static_cast<const ushort>(pageByteOffset / AutoSystemInfo::PageSize);
    const typename TBlockType::BlockInfo& blockInfoForPage = HeapInfo::GetBlockInfo<TBlockAttributes>(localObjectSize)[pageNumber];

    bool lastObjectOnPreviousPageMarked = false;
    // Calculate the mark count here since we no longer keep track during marking
    uint rescanMarkCount = TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex);
    const uint pageObjectCount = blockInfoForPage.pageObjectCount;
    const uint localObjectCount = (TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / localObjectSize;

    // With protected unallocatable ending pages and reset writewatch, we should never be scanning on these pages.
    if (firstObjectOnPageIndex >= localObjectCount)
    {
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 3);
    }

    // If all objects are marked, rescan whole block at once
    if (TBlockType::CanRescanFullBlock() && rescanMarkCount == pageObjectCount)
    {
        // REVIEW: Can we optimize this more?
        if (!recycler->AddMark(pageAddress, AutoSystemInfo::PageSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_ADD(recycler, markData.rescanObjectCount, pageObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize * pageObjectCount);
        if (anyObjectRescanned != nullptr)
        {
            *anyObjectRescanned = true;
        }

        return true;
    }

    if (startObjectAddress != pageAddress)
    {
        // If the last object on the previous page that spans into the current page is marked,
        // we need to count that in the markCount for rescan
        Assert(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress);
        lastObjectOnPreviousPageMarked = (heapBlockMarkBits->Test(startBitIndex) == TRUE);
        if (lastObjectOnPreviousPageMarked)
        {
            rescanMarkCount++;
        }
    }

    const uint objectBitDelta = SmallHeapBlockT<TBlockAttributes>::GetObjectBitDeltaForBucketIndex(bucketIndex);

    uint rescanCount = 0;
    uint objectIndex = firstObjectOnPageIndex;

    for (uint bitIndex = startBitIndex; rescanCount < rescanMarkCount; objectIndex++, bitIndex += objectBitDelta)
    {
        Assert(objectIndex < localObjectCount);
        Assert(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex));

        if (heapBlockMarkBits->Test(bitIndex))
        {
            char * objectAddress = blockStartAddress + objectIndex * localObjectSize;
            if (!TBlockType::RescanObject(block, objectAddress, localObjectSize, objectIndex, recycler))
            {
                // Failed to add to the mark stack due to OOM.
                return false;
            }

            rescanCount++;
        }
    }

    // Mark bits should not have changed during the Rescan
    if (startObjectAddress != pageAddress && lastObjectOnPreviousPageMarked)
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1);
    }
    else
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex));
    }

#if DBG
    // We stopped when we hit the rescanMarkCount.
    // Make sure no other objects were marked, otherwise our rescanMarkCount was wrong.
    for (uint i = objectIndex + 1; i < blockInfoForPage.lastObjectIndexOnPage; i++)
    {
        Assert(!heapBlockMarkBits->Test(i * objectBitDelta));
    }
#endif

    // Let the caller know if we rescanned anything on this page
    if (anyObjectRescanned != nullptr)
    {
        (*anyObjectRescanned) = (rescanCount > 0);
    }

    return true;
}